

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte *srcBuffer;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  undefined1 *puVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  undefined1 *puVar22;
  int iVar23;
  undefined1 *puVar24;
  int iVar25;
  undefined4 in_register_0000008c;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  uint uStack_12c;
  ulong uStack_128;
  ulong uStack_120;
  ulong *puStack_110;
  ulong uStack_108;
  ulong *puStack_f8;
  BIT_DStream_t BStack_f0;
  undefined1 *puStack_c8;
  undefined8 uStack_c0;
  ulong *puStack_b8;
  undefined1 *puStack_b0;
  ulong *puStack_a8;
  undefined1 *puStack_a0;
  ulong *puStack_98;
  ulong *puStack_90;
  ulong *puStack_88;
  size_t sStack_80;
  ulong *puStack_78;
  ulong *puStack_70;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  ulong uStack_58;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar10 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar10;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar10 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,maxDstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar26 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar13 = (ulong)uVar5;
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar11 = (ulong)uVar6;
  uVar17 = uVar26 + uVar13 + uVar11 + 6;
  if (maxDstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar17) {
    return 0xffffffffffffffec;
  }
  puStack_c8 = (undefined1 *)(maxDstSize + (long)dst);
  uStack_58 = maxDstSize + 3 >> 2;
  puStack_a0 = (undefined1 *)(uStack_58 + (long)dst);
  puStack_68 = puStack_a0 + uStack_58;
  puStack_60 = puStack_68 + uStack_58;
  if (puStack_c8 < puStack_60) {
    return 0xffffffffffffffec;
  }
  puStack_70 = (ulong *)((long)cSrc + uVar26 + 6);
  if (uVar26 == 0) {
    uVar18 = 0xffffffffffffffb8;
    puStack_b8 = (ulong *)0x0;
    puStack_a8 = (ulong *)0x0;
    puStack_88 = (ulong *)0x0;
    uVar28 = 0;
    uStack_108 = 0;
  }
  else {
    puStack_a8 = (ulong *)((long)cSrc + 6);
    puStack_88 = (ulong *)((long)cSrc + 0xe);
    if (uVar4 < 8) {
      uStack_108 = (ulong)*(byte *)puStack_a8;
      switch(uVar4) {
      case 7:
        uStack_108 = uStack_108 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      case 6:
        uStack_108 = uStack_108 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        uStack_108 = uStack_108 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      case 4:
        uStack_108 = uStack_108 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        uStack_108 = uStack_108 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
      case 2:
        uStack_108 = uStack_108 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar12 = *(byte *)((long)cSrc + uVar26 + 5);
        uVar27 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        if (bVar12 == 0) {
          uVar18 = 0xffffffffffffffec;
          uVar27 = 0;
        }
        else {
          uVar27 = ~uVar27 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
          uVar18 = uVar26;
        }
        uVar28 = (ulong)uVar27;
        puStack_b8 = puStack_a8;
      }
    }
    else {
      uStack_108 = *(ulong *)((long)cSrc + (uVar26 - 2));
      bVar12 = *(byte *)((long)cSrc + uVar26 + 5);
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = ~uVar27 + 9;
      if (bVar12 == 0) {
        uVar27 = 0;
      }
      uVar28 = (ulong)uVar27;
      uVar18 = uVar26 | -(ulong)(bVar12 == 0);
      puStack_b8 = (ulong *)((long)cSrc + (uVar26 - 2));
    }
  }
  if (0xffffffffffffff88 < uVar18) {
    return uVar18;
  }
  puStack_78 = (ulong *)((long)puStack_70 + uVar13);
  if (uVar13 == 0) {
    uVar13 = 0xffffffffffffffb8;
    uStack_128 = 0;
    uStack_12c = 0;
    puStack_f8 = (ulong *)0x0;
    puStack_70 = (ulong *)0x0;
    puStack_90 = (ulong *)0x0;
  }
  else {
    puStack_90 = (ulong *)((long)cSrc + uVar26 + 0xe);
    if (7 < uVar5) {
      uStack_128 = puStack_78[-1];
      bVar12 = *(byte *)((long)puStack_78 + -1);
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uStack_12c = ~uVar27 + 9;
      if (bVar12 == 0) {
        uStack_12c = 0;
      }
      uVar13 = uVar13 | -(ulong)(bVar12 == 0);
      puStack_f8 = puStack_78 + -1;
      goto LAB_0017d1bb;
    }
    uStack_128 = (ulong)(byte)*puStack_70;
    switch(uVar5) {
    case 2:
      goto LAB_0017d167;
    case 3:
      goto LAB_0017d15c;
    case 4:
      goto LAB_0017d151;
    case 5:
      goto LAB_0017d145;
    case 6:
      break;
    case 7:
      uStack_128 = uStack_128 | (ulong)*(byte *)((long)cSrc + uVar26 + 0xc) << 0x30;
      break;
    default:
      goto switchD_0017d103_default;
    }
    uStack_128 = uStack_128 + ((ulong)*(byte *)((long)cSrc + uVar26 + 0xb) << 0x28);
LAB_0017d145:
    uStack_128 = uStack_128 + ((ulong)*(byte *)((long)cSrc + uVar26 + 10) << 0x20);
LAB_0017d151:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 9) * 0x1000000;
LAB_0017d15c:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 8) * 0x10000;
LAB_0017d167:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 7) * 0x100;
switchD_0017d103_default:
    bVar12 = *(byte *)((long)puStack_78 + -1);
    uVar27 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    puStack_f8 = puStack_70;
    if (bVar12 == 0) {
      uVar13 = 0xffffffffffffffec;
      uStack_12c = 0;
    }
    else {
      uStack_12c = ~uVar27 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
    }
  }
LAB_0017d1bb:
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  srcBuffer = (byte *)((long)puStack_78 + uVar11);
  if (uVar11 == 0) {
    uVar11 = 0xffffffffffffffb8;
    uStack_120 = 0;
    uStack_c0 = (ulong)uStack_c0._4_4_ << 0x20;
    puStack_110 = (ulong *)0x0;
    puStack_78 = (ulong *)0x0;
    puStack_98 = (ulong *)0x0;
  }
  else {
    puStack_98 = puStack_78 + 1;
    if (7 < uVar6) {
      uStack_120 = *(ulong *)(srcBuffer + -8);
      bVar12 = srcBuffer[-1];
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      iVar15 = ~uVar27 + 9;
      if (bVar12 == 0) {
        iVar15 = 0;
      }
      uStack_c0 = CONCAT44(uStack_c0._4_4_,iVar15);
      uVar11 = uVar11 | -(ulong)(bVar12 == 0);
      puStack_110 = (ulong *)(srcBuffer + -8);
      goto LAB_0017d32a;
    }
    uStack_120 = (ulong)(byte)*puStack_78;
    switch(uVar6) {
    case 2:
      goto LAB_0017d2d7;
    case 3:
      goto LAB_0017d2cc;
    case 4:
      goto LAB_0017d2c1;
    case 5:
      goto LAB_0017d2b5;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)puStack_78 + 6) << 0x30;
      break;
    default:
      goto switchD_0017d273_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)puStack_78 + 5) << 0x28);
LAB_0017d2b5:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)puStack_78 + 4) << 0x20);
LAB_0017d2c1:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)puStack_78 + 3) * 0x1000000;
LAB_0017d2cc:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)puStack_78 + 2) * 0x10000;
LAB_0017d2d7:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)puStack_78 + 1) * 0x100;
switchD_0017d273_default:
    bVar12 = srcBuffer[-1];
    uVar27 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    if (bVar12 == 0) {
      uVar11 = 0xffffffffffffffec;
      iVar15 = 0;
    }
    else {
      iVar15 = ~uVar27 + 9 + ((uint)uVar6 * -8 + 0x40 & 0xffff);
    }
    uStack_c0 = CONCAT44(uStack_c0._4_4_,iVar15);
    puStack_110 = puStack_78;
  }
LAB_0017d32a:
  if (0xffffffffffffff88 < uVar11) {
    return uVar11;
  }
  uVar7 = *(undefined2 *)((long)DTable + 2);
  sVar10 = BIT_initDStream(&BStack_f0,srcBuffer,cSrcSize - uVar17);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puVar14 = (undefined1 *)((long)dst + (maxDstSize - 3));
  cVar9 = (char)uVar7;
  if (puStack_60 < puVar14 && 7 < (ulong)((long)puStack_c8 - (long)puStack_60)) {
    sStack_80 = BStack_f0.bitContainer;
    bVar12 = -cVar9 & 0x3f;
    lVar8 = uStack_58 * 3;
    do {
      puVar22 = (undefined1 *)dst;
      uVar11 = (uStack_108 << ((byte)uVar28 & 0x3f)) >> bVar12;
      uVar13 = (uStack_128 << ((byte)uStack_12c & 0x3f)) >> bVar12;
      uVar17 = (uStack_120 << ((byte)(uint)uStack_c0 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + (int)uVar28;
      uVar26 = (sStack_80 << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar12;
      uVar18 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar22 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar21 = *(byte *)((long)DTable + uVar13 * 2 + 4) + uStack_12c;
      puVar22[uStack_58] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)uStack_c0;
      puVar22[uStack_58 * 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar25 = *(byte *)((long)DTable + uVar26 * 2 + 4) + BStack_f0.bitsConsumed;
      puVar22[lVar8] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar11 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      uVar26 = (uStack_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 4) + iVar15;
      uVar13 = (sStack_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      uVar17 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar18 * 2 + 5);
      iVar21 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar21;
      puVar22[uStack_58 + 1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar22[uStack_58 * 2 + 1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar25;
      puVar22[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      uVar11 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      uVar13 = (uStack_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      iVar21 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar21;
      uVar17 = (sStack_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      uVar26 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[uStack_58 + 2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar23;
      puVar22[uStack_58 * 2 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar25;
      puVar22[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      uVar27 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar15;
      puVar22[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar11 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      bVar1 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar22[uStack_58 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (uStack_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar22[uStack_58 * 2 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (sStack_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      bVar3 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar22[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar15 = 3;
      if (puStack_b8 < puStack_88) {
        iVar20 = 3;
      }
      else {
        puStack_b8 = (ulong *)((long)puStack_b8 - (ulong)(uVar27 >> 3));
        uVar27 = uVar27 & 7;
        uStack_108 = *puStack_b8;
        iVar20 = 0;
      }
      uStack_12c = iVar21 + (uint)bVar1;
      if (puStack_90 <= puStack_f8) {
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3));
        uStack_12c = uStack_12c & 7;
        uStack_128 = *puStack_f8;
        iVar15 = 0;
      }
      uStack_c0._0_4_ = iVar23 + (uint)bVar2;
      iVar23 = 3;
      if (puStack_110 < puStack_98) {
        iVar21 = 3;
      }
      else {
        puStack_110 = (ulong *)((long)puStack_110 - (ulong)((uint)uStack_c0 >> 3));
        uStack_c0._0_4_ = (uint)uStack_c0 & 7;
        uStack_120 = *puStack_110;
        iVar21 = 0;
      }
      BStack_f0.bitsConsumed = iVar25 + (uint)bVar3;
      if (BStack_f0.limitPtr <= BStack_f0.ptr) {
        BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3));
        BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
        BStack_f0.bitContainer = *(size_t *)BStack_f0.ptr;
        iVar23 = 0;
        sStack_80 = BStack_f0.bitContainer;
      }
      uVar28 = (ulong)uVar27;
    } while ((puVar22 + lVar8 + 4 < puVar14) &&
            (dst = puVar22 + 4, ((iVar15 == 0 && iVar20 == 0) && iVar21 == 0) && iVar23 == 0));
    dst = puVar22 + 4;
    puStack_b0 = (undefined1 *)((long)dst + lVar8);
    puVar22 = (undefined1 *)((long)dst + uStack_58 * 2);
    puVar24 = (undefined1 *)((long)dst + uStack_58);
  }
  else {
    puStack_b0 = puStack_60;
    puVar22 = puStack_68;
    puVar24 = puStack_a0;
  }
  if ((puStack_a0 < dst) || (puStack_68 < puVar24)) {
    return 0xffffffffffffffec;
  }
  uVar11 = (ulong)(uint)uStack_c0;
  if (puStack_60 < puVar22) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)puStack_a0 - (long)dst) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar27 = (uint)uVar28;
      if (uVar27 < 0x41) {
        if (puStack_b8 < puStack_88) {
          if (puStack_b8 == puStack_a8) goto LAB_0017d87f;
          bVar29 = puStack_a8 <= (ulong *)((long)puStack_b8 - (uVar28 >> 3));
          uVar19 = (int)puStack_b8 - (int)puStack_a8;
          if (bVar29) {
            uVar19 = (uint)(uVar28 >> 3);
          }
          uVar27 = uVar27 + uVar19 * -8;
        }
        else {
          uVar19 = (uint)(uVar28 >> 3);
          uVar27 = uVar27 & 7;
          bVar29 = true;
        }
        uVar28 = (ulong)uVar27;
        puStack_b8 = (ulong *)((long)puStack_b8 - (ulong)uVar19);
        uStack_108 = *puStack_b8;
      }
      else {
LAB_0017d87f:
        bVar29 = false;
      }
      if ((puStack_a0 + -3 <= dst) || (!bVar29)) goto LAB_0017da2b;
      uVar13 = (uStack_108 << ((byte)uVar28 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar28;
      uVar17 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar13 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (uStack_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      uVar28 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar27 = (uint)uVar28;
  if (uVar27 < 0x41) {
    if (puStack_b8 < puStack_88) {
      if (puStack_b8 == puStack_a8) goto LAB_0017da2b;
      uVar19 = (int)puStack_b8 - (int)puStack_a8;
      if (puStack_a8 <= (ulong *)((long)puStack_b8 - (uVar28 >> 3))) {
        uVar19 = (uint)(uVar28 >> 3);
      }
      uVar27 = uVar27 + uVar19 * -8;
    }
    else {
      uVar19 = (uint)(uVar28 >> 3);
      uVar27 = uVar27 & 7;
    }
    uVar28 = (ulong)uVar27;
    puStack_b8 = (ulong *)((long)puStack_b8 - (ulong)uVar19);
    uStack_108 = *puStack_b8;
  }
LAB_0017da2b:
  uVar27 = (uint)uVar28;
  if (dst < puStack_a0) {
    do {
      uVar13 = (uStack_108 << ((byte)uVar28 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar27 = (int)uVar28 + (uint)*(byte *)((long)DTable + uVar13 * 2 + 4);
      uVar28 = (ulong)uVar27;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puStack_a0);
  }
  if (3 < (long)puStack_68 - (long)puVar24) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (uStack_12c < 0x41) {
        if (puStack_f8 < puStack_90) {
          if (puStack_f8 == puStack_70) goto LAB_0017daa9;
          bVar29 = puStack_70 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3));
          uVar19 = (int)puStack_f8 - (int)puStack_70;
          if (bVar29) {
            uVar19 = uStack_12c >> 3;
          }
          uStack_12c = uStack_12c + uVar19 * -8;
        }
        else {
          uVar19 = uStack_12c >> 3;
          uStack_12c = uStack_12c & 7;
          bVar29 = true;
        }
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)uVar19);
        uStack_128 = *puStack_f8;
      }
      else {
LAB_0017daa9:
        bVar29 = false;
      }
      if ((puStack_68 + -3 <= puVar24) || (!bVar29)) goto LAB_0017dbf6;
      uVar13 = (uStack_128 << ((byte)uStack_12c & 0x3f)) >> bVar12;
      iVar15 = *(byte *)((long)DTable + uVar13 * 2 + 4) + uStack_12c;
      uVar17 = (uStack_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar13 = (uStack_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (uStack_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      uStack_12c = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar24 = puVar24 + 4;
    } while( true );
  }
  if (uStack_12c < 0x41) {
    if (puStack_f8 < puStack_90) {
      if (puStack_f8 == puStack_70) goto LAB_0017dbf6;
      uVar19 = (int)puStack_f8 - (int)puStack_70;
      if (puStack_70 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_12c >> 3))) {
        uVar19 = uStack_12c >> 3;
      }
      uStack_12c = uStack_12c + uVar19 * -8;
    }
    else {
      uVar19 = uStack_12c >> 3;
      uStack_12c = uStack_12c & 7;
    }
    puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)uVar19);
    uStack_128 = *puStack_f8;
  }
LAB_0017dbf6:
  if (puVar24 < puStack_68) {
    do {
      uVar13 = (uStack_128 << ((byte)uStack_12c & 0x3f)) >> (-cVar9 & 0x3fU);
      uStack_12c = uStack_12c + *(byte *)((long)DTable + uVar13 * 2 + 4);
      *puVar24 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar24 = puVar24 + 1;
    } while (puVar24 < puStack_68);
  }
  if (3 < (long)puStack_60 - (long)puVar22) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar19 = (uint)uVar11;
      if (uVar19 < 0x41) {
        if (puStack_110 < puStack_98) {
          if (puStack_110 == puStack_78) goto LAB_0017dc6c;
          bVar29 = puStack_78 <= (ulong *)((long)puStack_110 - (uVar11 >> 3));
          uVar16 = (int)puStack_110 - (int)puStack_78;
          if (bVar29) {
            uVar16 = (uint)(uVar11 >> 3);
          }
          uVar19 = uVar19 + uVar16 * -8;
        }
        else {
          uVar16 = (uint)(uVar11 >> 3);
          uVar19 = uVar19 & 7;
          bVar29 = true;
        }
        uVar11 = (ulong)uVar19;
        puStack_110 = (ulong *)((long)puStack_110 - (ulong)uVar16);
        uStack_120 = *puStack_110;
      }
      else {
LAB_0017dc6c:
        bVar29 = false;
      }
      if ((puStack_60 + -3 <= puVar22) || (!bVar29)) goto LAB_0017ddb0;
      uVar13 = (uStack_120 << ((byte)uVar11 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar11;
      uVar17 = (uStack_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar22 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar11 = (uStack_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar15;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar13 = (uStack_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      uVar11 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15);
      puVar22[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar22 = puVar22 + 4;
    } while( true );
  }
  if ((uint)uStack_c0 < 0x41) {
    if (puStack_110 < puStack_98) {
      if (puStack_110 == puStack_78) goto LAB_0017ddb0;
      uVar19 = (int)puStack_110 - (int)puStack_78;
      if (puStack_78 <= (ulong *)((long)puStack_110 - (ulong)((uint)uStack_c0 >> 3))) {
        uVar19 = (uint)uStack_c0 >> 3;
      }
      uStack_c0._0_4_ = (uint)uStack_c0 + uVar19 * -8;
    }
    else {
      uVar19 = (uint)uStack_c0 >> 3;
      uStack_c0._0_4_ = (uint)uStack_c0 & 7;
    }
    uVar11 = (ulong)(uint)uStack_c0;
    puStack_110 = (ulong *)((long)puStack_110 - (ulong)uVar19);
    uStack_120 = *puStack_110;
  }
LAB_0017ddb0:
  uVar19 = (uint)uVar11;
  if (puVar22 < puStack_60) {
    do {
      uVar13 = (uStack_120 << ((byte)uVar11 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar19 = (int)uVar11 + (uint)*(byte *)((long)DTable + uVar13 * 2 + 4);
      uVar11 = (ulong)uVar19;
      *puVar22 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar22 = puVar22 + 1;
    } while (puVar22 < puStack_60);
  }
  if (3 < (long)puStack_c8 - (long)puStack_b0) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (BStack_f0.bitsConsumed < 0x41) {
        if (BStack_f0.ptr < BStack_f0.limitPtr) {
          if (BStack_f0.ptr == BStack_f0.start) goto LAB_0017de21;
          bVar29 = BStack_f0.start <=
                   (size_t *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3));
          uVar16 = (int)BStack_f0.ptr - (int)BStack_f0.start;
          if (bVar29) {
            uVar16 = BStack_f0.bitsConsumed >> 3;
          }
          BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)uVar16);
          BStack_f0.bitsConsumed = BStack_f0.bitsConsumed + uVar16 * -8;
          BStack_f0.bitContainer = *(size_t *)BStack_f0.ptr;
        }
        else {
          BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3));
          BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
          BStack_f0.bitContainer = *(size_t *)BStack_f0.ptr;
          bVar29 = true;
        }
      }
      else {
LAB_0017de21:
        bVar29 = false;
      }
      if ((puVar14 <= puStack_b0) || (!bVar29)) goto LAB_0017dfe3;
      uVar11 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar15 = *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_f0.bitsConsumed;
      *puStack_b0 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar15;
      puStack_b0[1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar15;
      puStack_b0[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      BStack_f0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar15;
      puStack_b0[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puStack_b0 = puStack_b0 + 4;
    } while( true );
  }
  if (BStack_f0.bitsConsumed < 0x41) {
    if (BStack_f0.ptr < BStack_f0.limitPtr) {
      if (BStack_f0.ptr == BStack_f0.start) goto LAB_0017dfe3;
      uVar16 = (int)BStack_f0.ptr - (int)BStack_f0.start;
      if (BStack_f0.start <= (size_t *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3)))
      {
        uVar16 = BStack_f0.bitsConsumed >> 3;
      }
      BStack_f0.bitsConsumed = BStack_f0.bitsConsumed + uVar16 * -8;
    }
    else {
      uVar16 = BStack_f0.bitsConsumed >> 3;
      BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
    }
    BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)uVar16);
    BStack_f0.bitContainer = *(size_t *)BStack_f0.ptr;
  }
LAB_0017dfe3:
  if (puStack_b0 < puStack_c8) {
    do {
      uVar11 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU)
      ;
      BStack_f0.bitsConsumed = *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_f0.bitsConsumed;
      *puStack_b0 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puStack_b0 = puStack_b0 + 1;
    } while (puStack_b0 < puStack_c8);
  }
  if (BStack_f0.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_f0.ptr != BStack_f0.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar19 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_110 != puStack_78) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_12c != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_f8 != puStack_70) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar27 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_b8 != puStack_a8) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}